

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::EmitGlobalBody(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ParseNodeProg *pPVar1;
  ParseNodeBin *pPVar2;
  BOOL fReturnValue;
  ParseNode *pPVar3;
  ParseNodePtr this_00;
  
  this_00 = funcInfo->root->pnodeBody;
  pPVar1 = ParseNode::AsParseNodeProg(&funcInfo->root->super_ParseNode);
  pPVar3 = pPVar1->pnodeLastValStmt;
  if ((pPVar3 == (ParseNode *)0x0) || ((pPVar3->field_0x1 & 0x10) != 0)) {
    Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,0xfffffffe);
  }
  if (this_00->nop == knopList) {
    do {
      pPVar2 = ParseNode::AsParseNodeBin(this_00);
      if (pPVar2->pnode1 == pPVar3) {
        pPVar3 = (ParseNode *)0x0;
      }
      if ((pPVar3 != (ParseNode *)0x0) || (fReturnValue = 1, (this->flags & 2) == 0)) {
        fReturnValue = 0;
      }
      EmitTopLevelStatement(this,pPVar2->pnode1,funcInfo,fReturnValue);
      pPVar2 = ParseNode::AsParseNodeBin(this_00);
      this_00 = pPVar2->pnode2;
    } while (this_00->nop == knopList);
  }
  EmitTopLevelStatement(this,this_00,funcInfo,0);
  return;
}

Assistant:

void ByteCodeGenerator::EmitGlobalBody(FuncInfo *funcInfo)
{
    // Emit global code (global scope or eval), fixing up the return register with the implicit
    // return value.
    ParseNode *pnode = funcInfo->root->pnodeBody;
    ParseNode *pnodeLastVal = funcInfo->root->AsParseNodeProg()->pnodeLastValStmt;
    if (pnodeLastVal == nullptr || pnodeLastVal->IsPatternDeclaration())
    {
        // We're not guaranteed to compute any values, so fix up the return register at the top
        // in case.
        this->m_writer.Reg1(Js::OpCode::LdUndef, ReturnRegister);
    }

    while (pnode->nop == knopList)
    {
        ParseNode *stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt == pnodeLastVal)
        {
            pnodeLastVal = nullptr;
        }
        if (pnodeLastVal == nullptr && (this->flags & fscrReturnExpression))
        {
            EmitTopLevelStatement(stmt, funcInfo, true);
        }
        else
        {
            // Haven't hit the post-dominating return value yet,
            // so don't bother with the return register.
            EmitTopLevelStatement(stmt, funcInfo, false);
        }
        pnode = pnode->AsParseNodeBin()->pnode2;
    }
    EmitTopLevelStatement(pnode, funcInfo, false);
}